

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O1

instruction_t __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::operator_to_instruction
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,binary_operator_t op)

{
  runtime_error *this_00;
  
  if (op < (EXPR_OP_PLUS|EXPR_OP_NEQ)) {
    return *(instruction_t *)(&DAT_001b4c5c + (ulong)op * 4);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"incomplete switch statement");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

enum tchecker::instruction_t operator_to_instruction(enum tchecker::binary_operator_t op)
  {
    switch (op) {
    case tchecker::EXPR_OP_LAND:
      return tchecker::VM_LAND;
    case tchecker::EXPR_OP_LT:
      return tchecker::VM_LT;
    case tchecker::EXPR_OP_LE:
      return tchecker::VM_LE;
    case tchecker::EXPR_OP_EQ:
      return tchecker::VM_EQ;
    case tchecker::EXPR_OP_NEQ:
      return tchecker::VM_NE;
    case tchecker::EXPR_OP_GE:
      return tchecker::VM_GE;
    case tchecker::EXPR_OP_GT:
      return tchecker::VM_GT;
    case tchecker::EXPR_OP_MINUS:
      return tchecker::VM_MINUS;
    case tchecker::EXPR_OP_PLUS:
      return tchecker::VM_SUM;
    case tchecker::EXPR_OP_TIMES:
      return tchecker::VM_MUL;
    case tchecker::EXPR_OP_DIV:
      return tchecker::VM_DIV;
    case tchecker::EXPR_OP_MOD:
      return tchecker::VM_MOD;
    default:
      throw std::runtime_error("incomplete switch statement");
    }
  }